

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_panel.cpp
# Opt level: O2

int Am_Panel_Set_Old_Owner_To_Me_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Wrapper *value;
  Am_Value *list_value;
  Am_Object cmd;
  Am_Object local_20;
  Am_Value_List parts;
  
  cmd.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&parts);
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)self,0xc5);
  Am_Object::operator=(&cmd,&local_20);
  Am_Object::~Am_Object(&local_20);
  bVar1 = Am_Object::Valid(&cmd);
  if (bVar1) {
    value = Am_Object::operator_cast_to_Am_Wrapper_(self);
    Am_Object::Set(&cmd,0x170,value,1);
  }
  list_value = Am_Object::Get(self,0x82,0);
  Am_Value_List::operator=(&parts,list_value);
  iVar2 = set_parts_list_commands_old_owner(&parts,self);
  Am_Value_List::~Am_Value_List(&parts);
  Am_Object::~Am_Object(&cmd);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, Am_Panel_Set_Old_Owner_To_Me)
{
  int ret = 0;
  Am_Object cmd;
  Am_Value_List parts;
  cmd = self.Get_Object(Am_COMMAND);
  if (cmd.Valid()) {
    cmd.Set(Am_SAVED_OLD_OWNER, self, Am_OK_IF_NOT_THERE);
    ret = 1;
  }
  parts = self.Get(Am_GRAPHICAL_PARTS);
  ret = set_parts_list_commands_old_owner(parts, self);

  //ret not used, different values just for debugging
  return ret;
}